

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O1

void gkc_summary_free(gkc_summary *s)

{
  list **pplVar1;
  freelist *pfVar2;
  freelist *__ptr;
  uint64_t uVar3;
  list *plVar4;
  list *plVar5;
  
  plVar5 = (s->head).next;
  if (plVar5 != &s->head) {
    uVar3 = s->alloced;
    plVar4 = (list *)s->fl;
    do {
      pplVar1 = &plVar5->next;
      uVar3 = uVar3 - 1;
      plVar5[-2].next = plVar4;
      plVar4 = (list *)&plVar5[-2].next;
      plVar5 = *pplVar1;
    } while (*pplVar1 != &s->head);
    s->alloced = uVar3;
    s->fl = (freelist *)plVar4;
  }
  __ptr = s->fl;
  while (__ptr != (freelist *)0x0) {
    pfVar2 = __ptr->next;
    free(__ptr);
    __ptr = pfVar2;
  }
  free(s);
  return;
}

Assistant:

void gkc_summary_free(struct gkc_summary *s)
{
    struct freelist *fl;
    struct list *cur;

    cur = s->head.next;
    while (cur != &s->head) {
        struct list *next;
        next = cur->next;
        gkc_free(s, list_to_tuple(cur));
        cur = next;
    }
    fl = s->fl;
    while (fl) {
        void *p;
        p = fl;
        fl = fl->next;
        free(p);
    }
    free(s);
}